

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntConv.H
# Opt level: O1

void amrex::readIntData<int,short>(int *data,size_t size,istream *is,IntDescriptor *id)

{
  int16_t iVar1;
  Ordering OVar2;
  Ordering OVar3;
  undefined8 in_RAX;
  IntDescriptor *this;
  size_t sVar4;
  short value;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  OVar2 = IntDescriptor::order(id);
  this = FPC::NativeIntDescriptor();
  OVar3 = IntDescriptor::order(this);
  if (size != 0) {
    sVar4 = 0;
    do {
      std::istream::read((char *)is,(long)&uStack_38 + 6);
      if (OVar2 != OVar3) {
        iVar1 = swapBytes(uStack_38._6_2_);
        uStack_38 = CONCAT26(iVar1,(undefined6)uStack_38);
      }
      data[sVar4] = (int)uStack_38._6_2_;
      sVar4 = sVar4 + 1;
    } while (size != sVar4);
  }
  return;
}

Assistant:

void readIntData (To* data, std::size_t size, std::istream& is,
                      const amrex::IntDescriptor& id)
    {
        From value;
        bool swapEndian = (id.order() != amrex::FPC::NativeIntDescriptor().order());
        for (std::size_t j = 0; j < size; ++j) {
            is.read((char*) &value, sizeof(From));
            if (swapEndian) value = swapBytes(value);
            data[j] = static_cast<To>(value);
        }
    }